

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcTerminatorSymbol::~IfcTerminatorSymbol(IfcTerminatorSymbol *this)

{
  ~IfcTerminatorSymbol
            ((IfcTerminatorSymbol *)
             &this[-1].super_IfcAnnotationSymbolOccurrence.super_IfcAnnotationOccurrence.
              super_IfcStyledItem.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.
              field_0x20);
  return;
}

Assistant:

IfcTerminatorSymbol() : Object("IfcTerminatorSymbol") {}